

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::session_impl::dht_sample_infohashes
          (session_impl *this,endpoint *ep,sha1_hash *target)

{
  sha1_hash *target_00;
  sha1_hash *ep_00;
  bool bVar1;
  element_type *this_00;
  anon_class_40_2_e8808026 local_68;
  function<void_(libtorrent::digest32<160L>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_int,_std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>,_std::vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>)>
  local_40;
  sha1_hash *local_20;
  sha1_hash *target_local;
  endpoint *ep_local;
  session_impl *this_local;
  
  local_20 = target;
  target_local = (sha1_hash *)ep;
  ep_local = (endpoint *)this;
  bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->m_dht);
  if (bVar1) {
    this_00 = ::std::
              __shared_ptr_access<libtorrent::dht::dht_tracker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<libtorrent::dht::dht_tracker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->m_dht);
    ep_00 = target_local;
    target_00 = local_20;
    local_68.this = this;
    boost::asio::ip::basic_endpoint<boost::asio::ip::udp>::basic_endpoint
              (&local_68.ep,(basic_endpoint<boost::asio::ip::udp> *)target_local);
    ::std::
    function<void(libtorrent::digest32<160l>,std::chrono::duration<long,std::ratio<1l,1000000000l>>,int,std::vector<libtorrent::digest32<160l>,std::allocator<libtorrent::digest32<160l>>>,std::vector<std::pair<libtorrent::digest32<160l>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>,std::allocator<std::pair<libtorrent::digest32<160l>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>>>)>
    ::
    function<libtorrent::aux::session_impl::dht_sample_infohashes(boost::asio::ip::basic_endpoint<boost::asio::ip::udp>const&,libtorrent::digest32<160l>const&)::__0,void>
              ((function<void(libtorrent::digest32<160l>,std::chrono::duration<long,std::ratio<1l,1000000000l>>,int,std::vector<libtorrent::digest32<160l>,std::allocator<libtorrent::digest32<160l>>>,std::vector<std::pair<libtorrent::digest32<160l>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>,std::allocator<std::pair<libtorrent::digest32<160l>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>>>)>
                *)&local_40,&local_68);
    libtorrent::dht::dht_tracker::sample_infohashes(this_00,(endpoint *)ep_00,target_00,&local_40);
    ::std::
    function<void_(libtorrent::digest32<160L>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_int,_std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>,_std::vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>)>
    ::~function(&local_40);
  }
  return;
}

Assistant:

void session_impl::dht_sample_infohashes(udp::endpoint const& ep, sha1_hash const& target)
	{
		if (!m_dht) return;
		m_dht->sample_infohashes(ep, target, [this, ep](sha1_hash const& nid
			, time_duration const interval
			, int const num, std::vector<sha1_hash> samples
			, std::vector<std::pair<sha1_hash, udp::endpoint>> nodes)
		{
			m_alerts.emplace_alert<dht_sample_infohashes_alert>(nid
				, ep, interval, num, std::move(samples), std::move(nodes));
		});
	}